

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O0

bool peparse::getExports(parsed_pe_conflict *p)

{
  bool bVar1;
  bool local_3c4;
  undefined1 local_360 [8];
  exportent a;
  VA symVA;
  int iStack_308;
  bool isForwarded;
  uint32_t symRVA;
  uint32_t eatIdx;
  uint16_t ordinal;
  uint8_t d;
  string symName;
  undefined1 local_2d8 [4];
  uint32_t curNameOff;
  section curNameSec;
  VA curNameVA;
  uint local_270;
  uint32_t curNameRVA;
  uint32_t i;
  uint32_t ordinalOff;
  section ordinalTableSec;
  VA ordinalTableVA;
  uint32_t local_200;
  uint32_t ordinalTableRVA;
  uint32_t ordinalBase;
  uint32_t eatOff;
  section eatSec;
  VA eatVA;
  uint32_t eatRVA;
  uint32_t namesOff;
  section namesSec;
  VA namesVA;
  uint32_t namesRVA;
  uint32_t numNames;
  string modName;
  undefined1 local_100 [4];
  uint32_t nameOff;
  section nameSec;
  VA nameVA;
  int local_98;
  uint32_t nameRva;
  uint32_t rvaofft;
  int local_84;
  VA local_80;
  VA addr;
  section s;
  data_directory exportDir;
  parsed_pe_conflict *p_local;
  
  if ((p->peHeader).nt.OptionalMagic == 0x10b) {
    s.sec._32_8_ = (p->peHeader).nt.OptionalHeader.DataDirectory[0];
  }
  else {
    if ((p->peHeader).nt.OptionalMagic != 0x20b) {
      p_local._7_1_ = 0;
      goto LAB_0011f4f4;
    }
    s.sec._32_8_ = (p->peHeader).nt.OptionalHeader64.DataDirectory[0];
  }
  if (s.sec.Characteristics != 0) {
    section::section((section *)&addr);
    if ((p->peHeader).nt.OptionalMagic == 0x10b) {
      local_80 = (VA)(s.sec._32_4_ + (p->peHeader).nt.OptionalHeader.ImageBase);
LAB_0011ea4f:
      bVar1 = getSecForVA(&p->internal->secs,local_80,(section *)&addr);
      if (bVar1) {
        local_98 = (int)local_80 - s.sectionName.field_2._8_4_;
        bVar1 = readDword((bounded_buffer *)s.sectionBase,local_98 + 0xc,
                          (uint32_t *)((long)&nameVA + 4));
        if (bVar1) {
          if ((p->peHeader).nt.OptionalMagic == 0x10b) {
            nameSec.sec._32_8_ = ZEXT48(nameVA._4_4_ + (p->peHeader).nt.OptionalHeader.ImageBase);
          }
          else {
            if ((p->peHeader).nt.OptionalMagic != 0x20b) {
              p_local._7_1_ = 0;
              local_84 = 1;
              goto LAB_0011f4b7;
            }
            nameSec.sec._32_8_ = (ulong)nameVA._4_4_ + (p->peHeader).nt.OptionalHeader64.ImageBase;
          }
          section::section((section *)local_100);
          bVar1 = getSecForVA(&p->internal->secs,nameSec.sec._32_8_,(section *)local_100);
          if (bVar1) {
            modName.field_2._12_4_ = nameSec.sec._32_4_ - nameSec.sectionName.field_2._8_4_;
            std::__cxx11::string::string((string *)&namesRVA);
            bVar1 = readCString((bounded_buffer *)nameSec.sectionBase,modName.field_2._12_4_,
                                (string *)&namesRVA);
            if (bVar1) {
              bVar1 = readDword((bounded_buffer *)s.sectionBase,local_98 + 0x18,
                                (uint32_t *)((long)&namesVA + 4));
              if (bVar1) {
                if (namesVA._4_4_ == 0) {
LAB_0011f498:
                  local_84 = 0;
                }
                else {
                  bVar1 = readDword((bounded_buffer *)s.sectionBase,local_98 + 0x20,
                                    (uint32_t *)&namesVA);
                  if (bVar1) {
                    if ((p->peHeader).nt.OptionalMagic == 0x10b) {
                      namesSec.sec._32_8_ =
                           ZEXT48((uint)namesVA + (p->peHeader).nt.OptionalHeader.ImageBase);
                    }
                    else {
                      if ((p->peHeader).nt.OptionalMagic != 0x20b) {
                        p_local._7_1_ = 0;
                        local_84 = 1;
                        goto LAB_0011f49f;
                      }
                      namesSec.sec._32_8_ =
                           (ulong)(uint)namesVA + (p->peHeader).nt.OptionalHeader64.ImageBase;
                    }
                    section::section((section *)&eatRVA);
                    bVar1 = getSecForVA(&p->internal->secs,namesSec.sec._32_8_,(section *)&eatRVA);
                    if (bVar1) {
                      eatVA._4_4_ = namesSec.sec._32_4_ - namesSec.sectionName.field_2._8_4_;
                      bVar1 = readDword((bounded_buffer *)s.sectionBase,local_98 + 0x1c,
                                        (uint32_t *)&eatVA);
                      if (bVar1) {
                        if ((p->peHeader).nt.OptionalMagic == 0x10b) {
                          eatSec.sec._32_8_ =
                               ZEXT48((uint)eatVA + (p->peHeader).nt.OptionalHeader.ImageBase);
                        }
                        else {
                          if ((p->peHeader).nt.OptionalMagic != 0x20b) {
                            p_local._7_1_ = 0;
                            local_84 = 1;
                            goto LAB_0011f45b;
                          }
                          eatSec.sec._32_8_ =
                               (ulong)(uint)eatVA + (p->peHeader).nt.OptionalHeader64.ImageBase;
                        }
                        section::section((section *)&ordinalBase);
                        bVar1 = getSecForVA(&p->internal->secs,eatSec.sec._32_8_,
                                            (section *)&ordinalBase);
                        if (bVar1) {
                          ordinalTableRVA = eatSec.sec._32_4_ - eatSec.sectionName.field_2._8_4_;
                          bVar1 = readDword((bounded_buffer *)s.sectionBase,local_98 + 0x10,
                                            &local_200);
                          if (bVar1) {
                            bVar1 = readDword((bounded_buffer *)s.sectionBase,local_98 + 0x24,
                                              (uint32_t *)((long)&ordinalTableVA + 4));
                            if (bVar1) {
                              if ((p->peHeader).nt.OptionalMagic == 0x10b) {
                                ordinalTableSec.sec._32_8_ =
                                     ZEXT48(ordinalTableVA._4_4_ +
                                            (p->peHeader).nt.OptionalHeader.ImageBase);
                              }
                              else {
                                if ((p->peHeader).nt.OptionalMagic != 0x20b) {
                                  p_local._7_1_ = 0;
                                  local_84 = 1;
                                  goto LAB_0011f44f;
                                }
                                ordinalTableSec.sec._32_8_ =
                                     (ulong)ordinalTableVA._4_4_ +
                                     (p->peHeader).nt.OptionalHeader64.ImageBase;
                              }
                              section::section((section *)&i);
                              bVar1 = getSecForVA(&p->internal->secs,ordinalTableSec.sec._32_8_,
                                                  (section *)&i);
                              if (bVar1) {
                                curNameRVA = ordinalTableSec.sec._32_4_ -
                                             ordinalTableSec.sectionName.field_2._8_4_;
                                for (local_270 = 0; local_270 < namesVA._4_4_;
                                    local_270 = local_270 + 1) {
                                  bVar1 = readDword((bounded_buffer *)namesSec.sectionBase,
                                                    eatVA._4_4_ + local_270 * 4,
                                                    (uint32_t *)((long)&curNameVA + 4));
                                  if (!bVar1) {
                                    p_local._7_1_ = 0;
                                    local_84 = 1;
                                    goto LAB_0011f443;
                                  }
                                  if ((p->peHeader).nt.OptionalMagic == 0x10b) {
                                    curNameSec.sec._32_8_ =
                                         ZEXT48(curNameVA._4_4_ +
                                                (p->peHeader).nt.OptionalHeader.ImageBase);
                                  }
                                  else {
                                    if ((p->peHeader).nt.OptionalMagic != 0x20b) {
                                      p_local._7_1_ = 0;
                                      local_84 = 1;
                                      goto LAB_0011f443;
                                    }
                                    curNameSec.sec._32_8_ =
                                         (ulong)curNameVA._4_4_ +
                                         (p->peHeader).nt.OptionalHeader64.ImageBase;
                                  }
                                  section::section((section *)local_2d8);
                                  bVar1 = getSecForVA(&p->internal->secs,curNameSec.sec._32_8_,
                                                      (section *)local_2d8);
                                  if (bVar1) {
                                    symName.field_2._12_4_ =
                                         curNameSec.sec._32_4_ -
                                         (int)curNameSec.sectionName.field_2._8_8_;
                                    std::__cxx11::string::string((string *)&eatIdx);
                                    while (bVar1 = readByte((bounded_buffer *)curNameSec.sectionBase
                                                            ,symName.field_2._12_4_,
                                                            (uint8_t *)((long)&symRVA + 3)), bVar1)
                                    {
                                      if (symRVA._3_1_ == '\0') {
                                        bVar1 = readWord((bounded_buffer *)
                                                         ordinalTableSec.sectionBase,
                                                         curNameRVA + local_270 * 2,
                                                         (uint16_t *)&symRVA);
                                        if (!bVar1) {
                                          p_local._7_1_ = 0;
                                          local_84 = 1;
                                          goto LAB_0011f3eb;
                                        }
                                        iStack_308 = (uint)(ushort)symRVA * 4;
                                        bVar1 = readDword((bounded_buffer *)eatSec.sectionBase,
                                                          ordinalTableRVA + iStack_308,
                                                          (uint32_t *)((long)&symVA + 4));
                                        if (!bVar1) {
                                          p_local._7_1_ = 0;
                                          local_84 = 1;
                                          goto LAB_0011f3eb;
                                        }
                                        local_3c4 = false;
                                        if ((uint)s.sec._32_4_ <= symVA._4_4_) {
                                          local_3c4 = symVA._4_4_ <
                                                      s.sec._32_4_ + s.sec.Characteristics;
                                        }
                                        symVA._3_1_ = local_3c4;
                                        if (local_3c4 == false) {
                                          if ((p->peHeader).nt.OptionalMagic == 0x10b) {
                                            a.moduleName.field_2._8_8_ =
                                                 ZEXT48(symVA._4_4_ +
                                                        (p->peHeader).nt.OptionalHeader.ImageBase);
                                          }
                                          else {
                                            if ((p->peHeader).nt.OptionalMagic != 0x20b) {
                                              p_local._7_1_ = 0;
                                              local_84 = 1;
                                              goto LAB_0011f3eb;
                                            }
                                            a.moduleName.field_2._8_8_ =
                                                 (ulong)symVA._4_4_ +
                                                 (p->peHeader).nt.OptionalHeader64.ImageBase;
                                          }
                                          exportent::exportent((exportent *)local_360);
                                          local_360 = (undefined1  [8])a.moduleName.field_2._8_8_;
                                          std::__cxx11::string::operator=
                                                    ((string *)&a,(string *)&eatIdx);
                                          std::__cxx11::string::operator=
                                                    ((string *)
                                                     (a.symbolName.field_2._M_local_buf + 8),
                                                     (string *)&namesRVA);
                                          std::__cxx11::
                                          list<peparse::exportent,_std::allocator<peparse::exportent>_>
                                          ::push_back(&p->internal->exports,(value_type *)local_360)
                                          ;
                                          exportent::~exportent((exportent *)local_360);
                                        }
                                        local_84 = 0;
                                        goto LAB_0011f3eb;
                                      }
                                      std::__cxx11::string::push_back('\0');
                                      symName.field_2._12_4_ = symName.field_2._12_4_ + 1;
                                    }
                                    p_local._7_1_ = 0;
                                    local_84 = 1;
LAB_0011f3eb:
                                    std::__cxx11::string::~string((string *)&eatIdx);
                                  }
                                  else {
                                    p_local._7_1_ = 0;
                                    local_84 = 1;
                                  }
                                  section::~section((section *)local_2d8);
                                  if (local_84 != 0) goto LAB_0011f443;
                                }
                                local_84 = 0;
                              }
                              else {
                                p_local._7_1_ = 0;
                                local_84 = 1;
                              }
LAB_0011f443:
                              section::~section((section *)&i);
                            }
                            else {
                              p_local._7_1_ = 0;
                              local_84 = 1;
                            }
                          }
                          else {
                            p_local._7_1_ = 0;
                            local_84 = 1;
                          }
                        }
                        else {
                          p_local._7_1_ = 0;
                          local_84 = 1;
                        }
LAB_0011f44f:
                        section::~section((section *)&ordinalBase);
                      }
                      else {
                        p_local._7_1_ = 0;
                        local_84 = 1;
                      }
                    }
                    else {
                      p_local._7_1_ = 0;
                      local_84 = 1;
                    }
LAB_0011f45b:
                    section::~section((section *)&eatRVA);
                    if (local_84 == 0) goto LAB_0011f498;
                  }
                  else {
                    p_local._7_1_ = 0;
                    local_84 = 1;
                  }
                }
              }
              else {
                p_local._7_1_ = 0;
                local_84 = 1;
              }
            }
            else {
              p_local._7_1_ = 0;
              local_84 = 1;
            }
LAB_0011f49f:
            std::__cxx11::string::~string((string *)&namesRVA);
          }
          else {
            p_local._7_1_ = 0;
            local_84 = 1;
          }
          section::~section((section *)local_100);
        }
        else {
          p_local._7_1_ = 0;
          local_84 = 1;
        }
      }
      else {
        p_local._7_1_ = 0;
        local_84 = 1;
      }
    }
    else {
      if ((p->peHeader).nt.OptionalMagic == 0x20b) {
        local_80 = (s.sec._32_8_ & 0xffffffff) + (p->peHeader).nt.OptionalHeader64.ImageBase;
        goto LAB_0011ea4f;
      }
      p_local._7_1_ = 0;
      local_84 = 1;
    }
LAB_0011f4b7:
    section::~section((section *)&addr);
    if (local_84 != 0) goto LAB_0011f4f4;
  }
  p_local._7_1_ = 1;
LAB_0011f4f4:
  return (bool)(p_local._7_1_ & 1);
}

Assistant:

bool getExports(parsed_pe *p) {
  data_directory exportDir;
  if (p->peHeader.nt.OptionalMagic == NT_OPTIONAL_32_MAGIC) {
    exportDir = p->peHeader.nt.OptionalHeader.DataDirectory[DIR_EXPORT];
  } else if (p->peHeader.nt.OptionalMagic == NT_OPTIONAL_64_MAGIC) {
    exportDir = p->peHeader.nt.OptionalHeader64.DataDirectory[DIR_EXPORT];
  } else {
    return false;
  }

  if (exportDir.Size != 0) {
    section s;
    VA addr;
    if (p->peHeader.nt.OptionalMagic == NT_OPTIONAL_32_MAGIC) {
      addr = exportDir.VirtualAddress + p->peHeader.nt.OptionalHeader.ImageBase;
    } else if (p->peHeader.nt.OptionalMagic == NT_OPTIONAL_64_MAGIC) {
      addr =
          exportDir.VirtualAddress + p->peHeader.nt.OptionalHeader64.ImageBase;
    } else {
      return false;
    }

    if (!getSecForVA(p->internal->secs, addr, s)) {
      return false;
    }

    auto rvaofft = static_cast<std::uint32_t>(addr - s.sectionBase);

    // get the name of this module
    std::uint32_t nameRva;
    if (!readDword(s.sectionData,
                   rvaofft + _offset(export_dir_table, NameRVA),
                   nameRva)) {
      return false;
    }

    VA nameVA;
    if (p->peHeader.nt.OptionalMagic == NT_OPTIONAL_32_MAGIC) {
      nameVA = nameRva + p->peHeader.nt.OptionalHeader.ImageBase;
    } else if (p->peHeader.nt.OptionalMagic == NT_OPTIONAL_64_MAGIC) {
      nameVA = nameRva + p->peHeader.nt.OptionalHeader64.ImageBase;
    } else {
      return false;
    }

    section nameSec;
    if (!getSecForVA(p->internal->secs, nameVA, nameSec)) {
      return false;
    }

    auto nameOff = static_cast<std::uint32_t>(nameVA - nameSec.sectionBase);
    string modName;
    if (!readCString(*nameSec.sectionData, nameOff, modName)) {
      return false;
    }

    // now, get all the named export symbols
    std::uint32_t numNames;
    if (!readDword(s.sectionData,
                   rvaofft + _offset(export_dir_table, NumberOfNamePointers),
                   numNames)) {
      return false;
    }

    if (numNames > 0) {
      // get the names section
      ::uint32_t namesRVA;
      if (!readDword(s.sectionData,
                     rvaofft + _offset(export_dir_table, NamePointerRVA),
                     namesRVA)) {
        return false;
      }

      VA namesVA;
      if (p->peHeader.nt.OptionalMagic == NT_OPTIONAL_32_MAGIC) {
        namesVA = namesRVA + p->peHeader.nt.OptionalHeader.ImageBase;
      } else if (p->peHeader.nt.OptionalMagic == NT_OPTIONAL_64_MAGIC) {
        namesVA = namesRVA + p->peHeader.nt.OptionalHeader64.ImageBase;
      } else {
        return false;
      }

      section namesSec;
      if (!getSecForVA(p->internal->secs, namesVA, namesSec)) {
        return false;
      }

      auto namesOff =
          static_cast<std::uint32_t>(namesVA - namesSec.sectionBase);

      // get the EAT section
      ::uint32_t eatRVA;
      if (!readDword(s.sectionData,
                     rvaofft + _offset(export_dir_table, ExportAddressTableRVA),
                     eatRVA)) {
        return false;
      }

      VA eatVA;
      if (p->peHeader.nt.OptionalMagic == NT_OPTIONAL_32_MAGIC) {
        eatVA = eatRVA + p->peHeader.nt.OptionalHeader.ImageBase;
      } else if (p->peHeader.nt.OptionalMagic == NT_OPTIONAL_64_MAGIC) {
        eatVA = eatRVA + p->peHeader.nt.OptionalHeader64.ImageBase;
      } else {
        return false;
      }

      section eatSec;
      if (!getSecForVA(p->internal->secs, eatVA, eatSec)) {
        return false;
      }

      auto eatOff = static_cast<std::uint32_t>(eatVA - eatSec.sectionBase);

      // get the ordinal base
      ::uint32_t ordinalBase;
      if (!readDword(s.sectionData,
                     rvaofft + _offset(export_dir_table, OrdinalBase),
                     ordinalBase)) {
        return false;
      }

      // get the ordinal table
      std::uint32_t ordinalTableRVA;
      if (!readDword(s.sectionData,
                     rvaofft + _offset(export_dir_table, OrdinalTableRVA),
                     ordinalTableRVA)) {
        return false;
      }

      VA ordinalTableVA;
      if (p->peHeader.nt.OptionalMagic == NT_OPTIONAL_32_MAGIC) {
        ordinalTableVA =
            ordinalTableRVA + p->peHeader.nt.OptionalHeader.ImageBase;
      } else if (p->peHeader.nt.OptionalMagic == NT_OPTIONAL_64_MAGIC) {
        ordinalTableVA =
            ordinalTableRVA + p->peHeader.nt.OptionalHeader64.ImageBase;
      } else {
        return false;
      }

      section ordinalTableSec;
      if (!getSecForVA(p->internal->secs, ordinalTableVA, ordinalTableSec)) {
        return false;
      }

      auto ordinalOff = static_cast<std::uint32_t>(ordinalTableVA -
                                                   ordinalTableSec.sectionBase);

      for (::uint32_t i = 0; i < numNames; i++) {
        ::uint32_t curNameRVA;
        if (!readDword(namesSec.sectionData,
                       namesOff + (i * sizeof(::uint32_t)),
                       curNameRVA)) {
          return false;
        }

        VA curNameVA;
        if (p->peHeader.nt.OptionalMagic == NT_OPTIONAL_32_MAGIC) {
          curNameVA = curNameRVA + p->peHeader.nt.OptionalHeader.ImageBase;
        } else if (p->peHeader.nt.OptionalMagic == NT_OPTIONAL_64_MAGIC) {
          curNameVA = curNameRVA + p->peHeader.nt.OptionalHeader64.ImageBase;
        } else {
          return false;
        }

        section curNameSec;

        if (!getSecForVA(p->internal->secs, curNameVA, curNameSec)) {
          return false;
        }

        auto curNameOff =
            static_cast<std::uint32_t>(curNameVA - curNameSec.sectionBase);
        string symName;
        std::uint8_t d;

        do {
          if (!readByte(curNameSec.sectionData, curNameOff, d)) {
            return false;
          }

          if (d == 0) {
            break;
          }

          symName.push_back(static_cast<char>(d));
          curNameOff++;
        } while (true);

        // now, for this i, look it up in the ExportOrdinalTable
        ::uint16_t ordinal;
        if (!readWord(ordinalTableSec.sectionData,
                      ordinalOff + (i * sizeof(uint16_t)),
                      ordinal)) {
          return false;
        }

        //::uint32_t  eatIdx = ordinal - ordinalBase;
        ::uint32_t eatIdx = (ordinal * sizeof(uint32_t));

        ::uint32_t symRVA;
        if (!readDword(eatSec.sectionData, eatOff + eatIdx, symRVA)) {
          return false;
        }

        bool isForwarded =
            ((symRVA >= exportDir.VirtualAddress) &&
             (symRVA < exportDir.VirtualAddress + exportDir.Size));

        if (!isForwarded) {
          VA symVA;
          if (p->peHeader.nt.OptionalMagic == NT_OPTIONAL_32_MAGIC) {
            symVA = symRVA + p->peHeader.nt.OptionalHeader.ImageBase;
          } else if (p->peHeader.nt.OptionalMagic == NT_OPTIONAL_64_MAGIC) {
            symVA = symRVA + p->peHeader.nt.OptionalHeader64.ImageBase;
          } else {
            return false;
          }

          exportent a;

          a.addr = symVA;
          a.symbolName = symName;
          a.moduleName = modName;
          p->internal->exports.push_back(a);
        }
      }
    }
  }

  return true;
}